

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::TextureFilterMinmaxFilteringTestCaseBase::iterate
          (TextureFilterMinmaxFilteringTestCaseBase *this)

{
  uint uVar1;
  RenderContext *context;
  SupportedTextureType *this_00;
  int iVar2;
  deUint32 err;
  GLuint GVar3;
  undefined4 extraout_var;
  pointer ppSVar5;
  mapped_type *pmVar6;
  TestError *this_01;
  TextureFilterMinmaxUtils *this_02;
  pointer pSVar7;
  pointer __k;
  GLuint resultTextureId;
  IVec2 scaledTextureSize;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  reductionModeTexelSumMap;
  Vector<int,_2> local_44;
  Vector<int,_3> local_3c;
  long lVar4;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  ppSVar5 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar5 ==
        (this->m_utils).m_supportedTextureTypes.
        super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    this_00 = *ppSVar5;
    for (pSVar7 = (this->m_utils).m_supportedTextureDataTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar7 != (this->m_utils).m_supportedTextureDataTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar7 = pSVar7 + 1) {
      uVar1 = pSVar7->m_testFlags;
      if ((((uVar1 & 1) != 0) && (((uVar1 & 4) == 0 || (this_00->m_type != 0x806f)))) &&
         (((uVar1 & 8) == 0 || (this_00->m_type != 0x8513)))) {
        reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header;
        reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (__k = (this->m_utils).m_reductionModeParams.
                   super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            __k != (this->m_utils).m_reductionModeParams.
                   super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
          if (__k->m_queryTestOnly == false) {
            scaledTextureSize.m_data[0] = (int)(this->m_renderScale * 32.0);
            scaledTextureSize.m_data[1] = scaledTextureSize.m_data[0];
            tcu::Vector<int,_3>::Vector(&local_3c,0x20);
            (*this_00->_vptr_SupportedTextureType[4])
                      (this_00,context,&local_3c,(ulong)pSVar7->m_format,(ulong)pSVar7->m_type,
                       (ulong)this->m_mipmapping);
            resultTextureId = 0;
            (**(code **)(lVar4 + 0x6f8))(1,&resultTextureId);
            err = (**(code **)(lVar4 + 0x800))();
            glu::checkError(err,"glGenTextures() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                            ,0x2b0);
            GVar3 = resultTextureId;
            tcu::Vector<int,_2>::Vector(&local_44,&scaledTextureSize);
            TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
                      (this_00,context,GVar3,&local_44,__k->m_reductionMode);
            GVar3 = resultTextureId;
            this_02 = (TextureFilterMinmaxUtils *)&stack0xffffffffffffffb4;
            tcu::Vector<int,_2>::Vector
                      ((Vector<int,_2> *)&stack0xffffffffffffffb4,&scaledTextureSize);
            GVar3 = TextureFilterMinmaxUtils::calcPixelSumValue
                              (this_02,context,GVar3,(IVec2 *)&stack0xffffffffffffffb4,0x1903,0x1401
                              );
            pmVar6 = std::
                     map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                     ::operator[](&reductionModeTexelSumMap,&__k->m_reductionMode);
            *pmVar6 = GVar3;
            (**(code **)(lVar4 + 0x480))(1,&resultTextureId);
          }
        }
        scaledTextureSize.m_data[0] = 0x8007;
        pmVar6 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                               *)&reductionModeTexelSumMap._M_t,scaledTextureSize.m_data);
        uVar1 = *pmVar6;
        resultTextureId = 0x9367;
        pmVar6 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                               *)&reductionModeTexelSumMap._M_t,
                              (key_type_conflict *)&resultTextureId);
        if (*pmVar6 <= uVar1) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,
                     "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB",
                     "reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                     ,699);
LAB_00aa1a43:
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        scaledTextureSize.m_data[0] = 0x8008;
        pmVar6 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                               *)&reductionModeTexelSumMap._M_t,scaledTextureSize.m_data);
        uVar1 = *pmVar6;
        resultTextureId = 0x9367;
        pmVar6 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                               *)&reductionModeTexelSumMap._M_t,
                              (key_type_conflict *)&resultTextureId);
        if (uVar1 <= *pmVar6) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,
                     "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB",
                     "reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                     ,0x2be);
          goto LAB_00aa1a43;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
        ::~_Rb_tree(&reductionModeTexelSumMap._M_t);
      }
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxFilteringTestCaseBase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			if (!dataTypeIter->hasFlag(TextureFilterMinmaxUtils::MINMAX))
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_3D) && textureType->getType() == GL_TEXTURE_3D)
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_CUBE) &&
				textureType->getType() == GL_TEXTURE_CUBE_MAP)
				continue;

			std::map<glw::GLint, glw::GLuint> reductionModeTexelSumMap;

			for (TextureFilterMinmaxUtils::ReductionModeParamIter paramIter = m_utils.getReductionModeParams().begin();
				 paramIter != m_utils.getReductionModeParams().end(); ++paramIter)
			{
				if (paramIter->m_queryTestOnly)
					continue;

				tcu::IVec2 scaledTextureSize(int(float(TEXTURE_FILTER_MINMAX_SIZE) * m_renderScale));

				textureType->generate(renderContext, tcu::IVec3(TEXTURE_FILTER_MINMAX_SIZE), dataTypeIter->m_format,
									  dataTypeIter->m_type, m_mipmapping);

				glw::GLuint resultTextureId = 0;
				gl.genTextures(1, &resultTextureId);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

				textureType->renderToFBO(renderContext, resultTextureId, scaledTextureSize, paramIter->m_reductionMode);

				reductionModeTexelSumMap[paramIter->m_reductionMode] = m_utils.calcPixelSumValue(
					renderContext, resultTextureId, scaledTextureSize, GL_RED, GL_UNSIGNED_BYTE);

				gl.deleteTextures(1, &resultTextureId);
			}

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB");

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}